

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O1

bool __thiscall iDynTree::optimalcontrol::TimeRange::operator==(TimeRange *this,TimeRange *rhs)

{
  bool bVar1;
  char cVar2;
  undefined1 uVar3;
  double local_28;
  double local_20;
  
  if ((this->m_anyTime != true) || (bVar1 = true, rhs->m_anyTime == false)) {
    if (this->m_anyTime == false && rhs->m_anyTime == false) {
      local_20 = rhs->m_initTime;
      cVar2 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&local_20,DEFAULT_TOL);
      if (cVar2 != '\0') {
        local_28 = rhs->m_endTime;
        uVar3 = iDynTree::checkDoublesAreEqual(&this->m_endTime,&local_28,DEFAULT_TOL);
        return (bool)uVar3;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TimeRange::operator==(const TimeRange &rhs) const
        {
            if (this->m_anyTime && rhs.m_anyTime) {
                return true;
            }

            if (rhs.m_anyTime) {
                return false;
            }

            if (this ->m_anyTime) {
                return false;
            }

            return (checkDoublesAreEqual(this->m_initTime, rhs.initTime()) && checkDoublesAreEqual(this->m_endTime, rhs.endTime()));//((this->m_initTime == rhs.initTime())&&(this->m_endTime == rhs.endTime()));
        }